

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O3

void __thiscall GB::rrc_mr(GB *this,u16 mr)

{
  byte bVar1;
  long lVar2;
  u8 uVar3;
  
  lVar2 = (this->s).op_tick;
  if (lVar2 == 0x1e) {
    bVar1 = (this->s).field_6.field_0.z;
    (this->s).field_2.field_0.f = (bVar1 == 0) << 7 | (bVar1 & 1) << 4;
    Write(this,mr,bVar1 >> 1 | bVar1 << 7);
    (this->s).op_tick = -2;
  }
  else if (lVar2 == 0x16) {
    uVar3 = Read(this,mr);
    (this->s).field_6.field_0.z = uVar3;
  }
  return;
}

Assistant:

void GB::rrc_mr(u16 mr) {
  switch (s.op_tick) {
    case 22: s.z = Read(mr); break;
    case 30: Write(mr, rrc(s.z)); op_done(); break;
  }
}